

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontDescriptorWriter.cpp
# Opt level: O1

uint __thiscall
FontDescriptorWriter::CalculateFlags
          (FontDescriptorWriter *this,FreeTypeFaceWrapper *inFontInfo,
          UIntAndGlyphEncodingInfoVector *inEncodedGlyphs)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  FreeTypeFaceWrapper *this_00;
  uint uVar4;
  int iVar5;
  
  bVar2 = FreeTypeFaceWrapper::IsFixedPitch(inFontInfo);
  this_00 = inFontInfo;
  bVar3 = FreeTypeFaceWrapper::IsSerif(inFontInfo);
  uVar4 = bVar2 + 2;
  if (!bVar3) {
    uVar4 = (uint)bVar2;
  }
  bVar2 = IsSymbolic((FontDescriptorWriter *)this_00,inFontInfo,inEncodedGlyphs);
  iVar5 = 0x20;
  if (bVar2) {
    iVar5 = 4;
  }
  bVar2 = FreeTypeFaceWrapper::IsScript(inFontInfo);
  uVar1 = iVar5 + uVar4 + 8;
  if (!bVar2) {
    uVar1 = uVar4 + iVar5;
  }
  bVar2 = FreeTypeFaceWrapper::IsItalic(inFontInfo);
  uVar4 = uVar1 | 0x40;
  if (!bVar2) {
    uVar4 = uVar1;
  }
  bVar2 = FreeTypeFaceWrapper::IsForceBold(inFontInfo);
  uVar1 = uVar4 | 0x40000;
  if (!bVar2) {
    uVar1 = uVar4;
  }
  return uVar1;
}

Assistant:

unsigned int FontDescriptorWriter::CalculateFlags(	FreeTypeFaceWrapper* inFontInfo,
													const UIntAndGlyphEncodingInfoVector& inEncodedGlyphs)
{
	unsigned int flags = 0;

	// see FreeTypeFaceWrapper::GetFontFlags for explanation, if you must

	if(inFontInfo->IsFixedPitch())
		flags |= 1;
	if(inFontInfo->IsSerif())
		flags |= 2;
	if(IsSymbolic(inFontInfo,inEncodedGlyphs))
		flags |= 4;
	else
		flags |= 32;
	if(inFontInfo->IsScript())
		flags |= 8;
	if(inFontInfo->IsItalic())
		flags |= 64;
	if(inFontInfo->IsForceBold())
		flags |= (1<<18);

	return flags;
	
}